

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

bool __thiscall
ON_Triangle::GetTightBoundingBox
          (ON_Triangle *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000011;
  uint bGrowBox_00;
  long lVar3;
  ON_3dPoint P;
  
  bGrowBox_00 = 0;
  if ((int)CONCAT71(in_register_00000011,bGrowBox) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox_00 = (uint)bVar1;
  }
  if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), !bVar1)) {
    bVar1 = true;
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      ON_Xform::operator*(&P,xform,(ON_3dPoint *)((long)&this->m_V[0].x + lVar3));
      bVar2 = ON_BoundingBox::Set(tight_bbox,&P,bGrowBox_00);
      bVar1 = (bool)(bVar1 & bVar2);
      bGrowBox_00 = 1;
    }
    return bVar1;
  }
  GetBoundingBox(this,tight_bbox,bGrowBox_00);
  return true;
}

Assistant:

bool ON_Triangle::GetTightBoundingBox(
	ON_BoundingBox& tight_bbox,
	bool bGrowBox,
	const ON_Xform* xform ) const
{
	if (bGrowBox && !tight_bbox.IsValid())
	{
		bGrowBox = false;
	}

	bool rc = true;
	if (xform && !xform->IsIdentity())
	{
		for (int i = 0; i < 3; i++)
		{
			ON_3dPoint P = (*xform)*m_V[i];
			rc = tight_bbox.Set(P, bGrowBox) && rc;
			bGrowBox = true;
		}
	}
	else
	{
		rc =GetBoundingBox(tight_bbox, bGrowBox);
	}

	return rc;
}